

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c;
  ImVec2 min;
  int rect_type_local;
  ImGuiWindow *window_local;
  
  min.x = (float)rect_type;
  unique0x100001aa = window;
  if (rect_type == 0) {
    _window_local = ImGuiWindow::Rect(window);
  }
  else if (rect_type == 1) {
    _window_local = window->OuterRectClipped;
  }
  else if (rect_type == 2) {
    _window_local = window->InnerRect;
  }
  else if (rect_type == 3) {
    _window_local = window->InnerClipRect;
  }
  else if (rect_type == 4) {
    _window_local = window->WorkRect;
  }
  else if (rect_type == 5) {
    local_34 = ::operator-(&(window->InnerRect).Min,&window->Scroll);
    local_2c = ::operator+(&local_34,&stack0xffffffffffffffe0->WindowPadding);
    local_3c = ::operator+(&local_2c,&stack0xffffffffffffffe0->ContentSize);
    ImRect::ImRect((ImRect *)&window_local,&local_2c,&local_3c);
  }
  else {
    if (rect_type != 6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x26ac,
                    "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                   );
    }
    _window_local = window->ContentRegionRect;
  }
  return _window_local;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }